

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int sam_read1(htsFile *fp,bam_hdr_t *h,bam1_t *b)

{
  htsExactFormat hVar1;
  int iVar2;
  int ret;
  int r;
  bam1_t *b_local;
  bam_hdr_t *h_local;
  htsFile *fp_local;
  
  hVar1 = (fp->format).format;
  _ret = b;
  b_local = (bam1_t *)h;
  h_local = (bam_hdr_t *)fp;
  if (hVar1 == sam) {
    do {
      if ((h_local->target_len == (uint32_t *)0x0) &&
         (iVar2 = hts_getline((htsFile *)h_local,2,(kstring_t *)&h_local->target_len), iVar2 < 0)) {
        return -1;
      }
      fp_local._4_4_ = sam_parse1((kstring_t *)&h_local->target_len,(bam_hdr_t *)b_local,_ret);
      h_local->target_len = (uint32_t *)0x0;
      if (-1 < fp_local._4_4_) {
        return fp_local._4_4_;
      }
      if (0 < hts_verbose) {
        fprintf(_stderr,"[W::%s] parse error at line %lld\n","sam_read1",
                *(undefined8 *)&h_local->l_text);
      }
    } while ((b_local->core).pos != 0);
  }
  else if (hVar1 == bam) {
    fp_local._4_4_ = bam_read1((fp->fp).bgzf,b);
    if ((-1 < fp_local._4_4_) &&
       (((((b_local->core).tid <= (_ret->core).tid || ((_ret->core).tid < -1)) ||
         ((b_local->core).tid <= (_ret->core).mtid)) || ((_ret->core).mtid < -1)))) {
      fp_local._4_4_ = -3;
    }
  }
  else {
    if (hVar1 != cram) {
      abort();
    }
    fp_local._4_4_ = cram_get_bam_seq((fp->fp).cram,(bam_seq_t **)&ret);
  }
  return fp_local._4_4_;
}

Assistant:

int sam_read1(htsFile *fp, bam_hdr_t *h, bam1_t *b)
{
    switch (fp->format.format) {
    case bam: {
        int r = bam_read1(fp->fp.bgzf, b);
        if (r >= 0) {
            if (b->core.tid  >= h->n_targets || b->core.tid  < -1 ||
                b->core.mtid >= h->n_targets || b->core.mtid < -1)
                return -3;
        }
        return r;
        }

    case cram:
        return cram_get_bam_seq(fp->fp.cram, &b);

    case sam: {
        int ret;
err_recover:
        if (fp->line.l == 0) {
            ret = hts_getline(fp, KS_SEP_LINE, &fp->line);
            if (ret < 0) return -1;
        }
        ret = sam_parse1(&fp->line, h, b);
        fp->line.l = 0;
        if (ret < 0) {
            if (hts_verbose >= 1)
                fprintf(stderr, "[W::%s] parse error at line %lld\n", __func__, (long long)fp->lineno);
            if (h->ignore_sam_err) goto err_recover;
        }
        return ret;
        }

    default:
        abort();
    }
}